

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O2

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  jpeg_error_mgr *pjVar4;
  uint uVar5;
  jpeg_comp_master *pjVar6;
  long lVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  boolean *pbVar13;
  int iVar14;
  int iVar15;
  jpeg_scan_info *pjVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  boolean component_sent [10];
  uint local_a38 [642];
  
  pjVar6 = (jpeg_comp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->master = pjVar6;
  pjVar6->prepare_for_pass = prepare_for_pass;
  pjVar6->pass_startup = pass_startup;
  pjVar6->finish_pass = finish_pass_master;
  pjVar6->is_last_pass = 0;
  uVar5 = cinfo->image_height;
  if ((((uVar5 == 0) || (cinfo->image_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x20;
    (*pjVar4->error_exit)((j_common_ptr)cinfo);
    uVar5 = cinfo->image_height;
  }
  if ((0xffdc < uVar5) || (uVar5 = cinfo->image_width, 0xffdc < uVar5)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffdc00000029;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    uVar5 = cinfo->image_width;
  }
  if ((long)cinfo->input_components * (ulong)uVar5 >> 0x20 != 0) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x46;
    (*pjVar4->error_exit)((j_common_ptr)cinfo);
  }
  iVar15 = cinfo->data_precision;
  if (iVar15 != 8) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0xf;
    (pjVar4->msg_parm).i[0] = iVar15;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar15 = cinfo->num_components;
  if (10 < iVar15) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x1a;
    (pjVar4->msg_parm).i[0] = iVar15;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  piVar12 = &cinfo->comp_info->v_samp_factor;
  iVar15 = 1;
  iVar18 = 1;
  for (iVar14 = 0; iVar9 = cinfo->num_components, iVar14 < iVar9; iVar14 = iVar14 + 1) {
    iVar9 = piVar12[-1];
    if ((iVar9 - 5U < 0xfffffffc) || (iVar11 = *piVar12, iVar11 - 5U < 0xfffffffc)) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x12;
      (*pjVar4->error_exit)((j_common_ptr)cinfo);
      iVar15 = cinfo->max_h_samp_factor;
      iVar18 = cinfo->max_v_samp_factor;
      iVar9 = piVar12[-1];
      iVar11 = *piVar12;
    }
    if (iVar9 < iVar15) {
      iVar9 = iVar15;
    }
    cinfo->max_h_samp_factor = iVar9;
    if (iVar11 < iVar18) {
      iVar11 = iVar18;
    }
    cinfo->max_v_samp_factor = iVar11;
    piVar12 = piVar12 + 0x18;
    iVar15 = iVar9;
    iVar18 = iVar11;
  }
  pbVar13 = &cinfo->comp_info->component_needed;
  for (iVar15 = 0; iVar15 < iVar9; iVar15 = iVar15 + 1) {
    pbVar13[-0xb] = iVar15;
    pbVar13[-3] = 8;
    lVar7 = jdiv_round_up((long)pbVar13[-10] * (ulong)cinfo->image_width,
                          (long)cinfo->max_h_samp_factor << 3);
    pbVar13[-5] = (JDIMENSION)lVar7;
    lVar7 = jdiv_round_up((long)pbVar13[-9] * (ulong)cinfo->image_height,
                          (long)cinfo->max_v_samp_factor << 3);
    pbVar13[-4] = (JDIMENSION)lVar7;
    lVar7 = jdiv_round_up((long)pbVar13[-10] * (ulong)cinfo->image_width,
                          (long)cinfo->max_h_samp_factor);
    pbVar13[-2] = (JDIMENSION)lVar7;
    lVar7 = jdiv_round_up((long)pbVar13[-9] * (ulong)cinfo->image_height,
                          (long)cinfo->max_v_samp_factor);
    pbVar13[-1] = (JDIMENSION)lVar7;
    *pbVar13 = 1;
    iVar9 = cinfo->num_components;
    pbVar13 = pbVar13 + 0x18;
  }
  lVar7 = jdiv_round_up((ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
  cinfo->total_iMCU_rows = (JDIMENSION)lVar7;
  pjVar16 = cinfo->scan_info;
  pbVar13 = &cinfo->num_scans;
  if (pjVar16 == (jpeg_scan_info *)0x0) {
    cinfo->progressive_mode = 0;
LAB_00118680:
    *pbVar13 = 1;
  }
  else {
    if (*pbVar13 < 1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x13;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      pjVar16 = cinfo->scan_info;
    }
    if ((pjVar16->Ss == 0) && (pjVar16->Se == 0x3f)) {
      cinfo->progressive_mode = 0;
      uVar10 = 0;
      uVar19 = (ulong)(uint)cinfo->num_components;
      if (cinfo->num_components < 1) {
        uVar19 = uVar10;
      }
      for (; uVar19 != uVar10; uVar10 = uVar10 + 1) {
        component_sent[uVar10] = 0;
      }
    }
    else {
      cinfo->progressive_mode = 1;
      puVar8 = local_a38;
      for (iVar15 = 0; iVar15 < cinfo->num_components; iVar15 = iVar15 + 1) {
        for (lVar7 = 0; (int)lVar7 != 0x100; lVar7 = lVar7 + 4) {
          *(undefined4 *)((long)puVar8 + lVar7) = 0xffffffff;
        }
        puVar8 = (uint *)((long)puVar8 + lVar7);
      }
    }
    for (iVar15 = 1; iVar15 <= *pbVar13; iVar15 = iVar15 + 1) {
      uVar5 = pjVar16->comps_in_scan;
      if (uVar5 - 5 < 0xfffffffc) {
        pjVar4 = cinfo->err;
        pjVar4->msg_code = 0x1a;
        (pjVar4->msg_parm).i[0] = uVar5;
        (cinfo->err->msg_parm).i[1] = 4;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      uVar19 = 0;
      if (0 < (int)uVar5) {
        uVar19 = (ulong)uVar5;
      }
      for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
        iVar18 = pjVar16->component_index[uVar10];
        if ((iVar18 < 0) || (cinfo->num_components <= iVar18)) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x13;
          (pjVar4->msg_parm).i[0] = iVar15;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if ((uVar10 != 0) && (iVar18 <= pjVar16->component_index[uVar10 - 1])) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x13;
          (pjVar4->msg_parm).i[0] = iVar15;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
      }
      uVar1 = pjVar16->Ss;
      lVar7 = (long)(int)uVar1;
      iVar18 = pjVar16->Se;
      uVar2 = pjVar16->Ah;
      uVar3 = pjVar16->Al;
      if (cinfo->progressive_mode == 0) {
        if ((((uVar1 != 0) || (iVar18 != 0x3f)) || (uVar2 != 0)) || (uVar3 != 0)) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x11;
          (pjVar4->msg_parm).i[0] = iVar15;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
          iVar18 = pjVar16->component_index[uVar10];
          if (component_sent[iVar18] != 0) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x13;
            (pjVar4->msg_parm).i[0] = iVar15;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          component_sent[iVar18] = 1;
        }
      }
      else {
        if (((0x3f < uVar1) || (iVar18 < (int)uVar1)) ||
           ((0x3f < iVar18 || ((10 < uVar2 || (10 < uVar3)))))) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x11;
          (pjVar4->msg_parm).i[0] = iVar15;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (uVar1 == 0) {
          if (iVar18 != 0) goto LAB_001184e8;
        }
        else if (uVar5 != 1) {
LAB_001184e8:
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x11;
          (pjVar4->msg_parm).i[0] = iVar15;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
          puVar8 = local_a38 + (long)pjVar16->component_index[uVar10] * 0x40;
          lVar17 = lVar7;
          if ((uVar1 != 0) && ((int)*puVar8 < 0)) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x11;
            (pjVar4->msg_parm).i[0] = iVar15;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          for (; lVar17 <= iVar18; lVar17 = lVar17 + 1) {
            if ((int)puVar8[lVar17] < 0) {
              if (uVar2 != 0) goto LAB_00118578;
            }
            else if (puVar8[lVar17] != uVar2 || uVar2 - 1 != uVar3) {
LAB_00118578:
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x11;
              (pjVar4->msg_parm).i[0] = iVar15;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            puVar8[lVar17] = uVar3;
          }
        }
      }
      pjVar16 = pjVar16 + 1;
    }
    if (cinfo->progressive_mode == 0) {
      for (lVar7 = 0; lVar7 < cinfo->num_components; lVar7 = lVar7 + 1) {
        if (component_sent[lVar7] == 0) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x2d;
          (*pjVar4->error_exit)((j_common_ptr)cinfo);
        }
      }
    }
    else {
      puVar8 = local_a38;
      for (lVar7 = 0; lVar7 < cinfo->num_components; lVar7 = lVar7 + 1) {
        if ((int)*puVar8 < 0) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x2d;
          (*pjVar4->error_exit)((j_common_ptr)cinfo);
        }
        puVar8 = puVar8 + 0x40;
      }
    }
    if ((cinfo->progressive_mode != 0) && (cinfo->arith_code == 0)) {
      pbVar13 = &cinfo->optimize_coding;
      goto LAB_00118680;
    }
  }
  if (transcode_only == 0) {
    *(undefined4 *)&pjVar6[1].prepare_for_pass = 0;
    iVar15 = cinfo->optimize_coding;
    *(undefined4 *)((long)&pjVar6[1].pass_startup + 4) = 0;
    *(undefined4 *)((long)&pjVar6[1].prepare_for_pass + 4) = 0;
    if (iVar15 == 0) goto LAB_001186e2;
  }
  else {
    if (cinfo->optimize_coding == 0) {
      pjVar6[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x2;
      *(undefined4 *)((long)&pjVar6[1].pass_startup + 4) = 0;
LAB_001186e2:
      iVar15 = cinfo->num_scans;
      goto LAB_001186ea;
    }
    pjVar6[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x1;
    *(undefined4 *)((long)&pjVar6[1].pass_startup + 4) = 0;
  }
  iVar15 = cinfo->num_scans * 2;
LAB_001186ea:
  *(int *)&pjVar6[1].pass_startup = iVar15;
  pjVar6[1].finish_pass =
       (_func_void_j_compress_ptr *)"libjpeg-turbo version 2.1.1 (build 20250502)";
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control(j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *)master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if (cinfo->progressive_mode && !cinfo->arith_code)  /*  TEMPORARY HACK ??? */
    cinfo->optimize_coding = TRUE; /* assume default tables no good for progressive mode */

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;

  master->jpeg_version = PACKAGE_NAME " version " VERSION " (build " BUILD ")";
}